

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCase.cpp
# Opt level: O2

void __thiscall xe::TestSet::add(TestSet *this,TestNode *node)

{
  Error *this_00;
  
  if (node->m_nodeType < TESTNODETYPE_TEST_CASE) {
    addGroup(this,(TestGroup *)node);
    return;
  }
  if (node->m_nodeType == TESTNODETYPE_TEST_CASE) {
    addNodeAndParents((set<const_xe::TestNode_*,_std::less<const_xe::TestNode_*>,_std::allocator<const_xe::TestNode_*>_>
                       *)this,node);
    return;
  }
  this_00 = (Error *)__cxa_allocate_exception(0x10);
  Error::Error(this_00,(char *)0x0,
               "node->getNodeType() == TESTNODETYPE_GROUP || node->getNodeType() == TESTNODETYPE_ROOT"
               ,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/executor/xeTestCase.cpp"
               ,0x17d);
  __cxa_throw(this_00,&Error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void TestSet::add (const TestNode* node)
{
	if (node->getNodeType() == TESTNODETYPE_TEST_CASE)
		addCase(static_cast<const TestCase*>(node));
	else
	{
		XE_CHECK(node->getNodeType() == TESTNODETYPE_GROUP ||
				  node->getNodeType() == TESTNODETYPE_ROOT);
		addGroup(static_cast<const TestGroup*>(node));
	}
}